

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_modifiers.cpp
# Opt level: O0

void __thiscall EnumerationParse_SetC_Test::TestBody(EnumerationParse_SetC_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *pcVar2;
  enumeration *lhs;
  literal *in_R8;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_810;
  AssertHelper local_7b0;
  Message local_7a8;
  enumeration local_79c;
  undefined1 local_798 [8];
  AssertionResult gtest_ar;
  string local_780;
  AssertHelper local_760;
  Message local_758;
  undefined1 local_750 [8];
  AssertionResult gtest_ar_;
  string local_738;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_718;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_710;
  bool local_701;
  ostringstream local_700 [7];
  bool ok;
  string_stream errors;
  ostringstream local_588 [8];
  string_stream output;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40c;
  undefined1 local_40b;
  allocator local_40a;
  allocator local_409;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  string local_3e0 [32];
  iterator local_3c0;
  size_type local_3b8;
  undefined1 local_3b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argv;
  string local_390;
  allocator local_369;
  string local_368;
  literal local_348;
  allocator local_2f9;
  string local_2f8;
  allocator local_2d1;
  string local_2d0;
  literal local_2b0;
  allocator local_261;
  string local_260;
  allocator local_229;
  string local_228;
  literal local_208;
  values local_1c0;
  undefined1 local_c0 [8];
  opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  enum_opt;
  EnumerationParse_SetC_Test *this_local;
  
  enum_opt.parser_.super_parser_base.literals_.
  super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"a",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_260,"a description",&local_261);
  pstore::command_line::literal::literal(&local_208,&local_228,0,&local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d0,"b",&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f8,"b description",&local_2f9);
  pstore::command_line::literal::literal(&local_2b0,&local_2d0,1,&local_2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_368,"c",&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_390,"c description",
             (allocator *)
             ((long)&argv.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pstore::command_line::literal::literal(&local_348,&local_368,2,&local_390);
  pstore::command_line::
  values<pstore::command_line::literal,pstore::command_line::literal,pstore::command_line::literal>
            (&local_1c0,(command_line *)&local_208,&local_2b0,&local_348,in_R8);
  pstore::command_line::
  opt<(anonymous_namespace)::enumeration,pstore::command_line::parser<(anonymous_namespace)::enumeration,void>>
  ::opt<char[12],pstore::command_line::details::values>
            ((opt<(anonymous_namespace)::enumeration,pstore::command_line::parser<(anonymous_namespace)::enumeration,void>>
              *)local_c0,(char (*) [12])"enumeration",&local_1c0);
  pstore::command_line::details::values::~values(&local_1c0);
  pstore::command_line::literal::~literal(&local_348);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&argv.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  pstore::command_line::literal::~literal(&local_2b0);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  pstore::command_line::literal::~literal(&local_208);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  local_40b = 1;
  local_408 = &local_400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_400,"progname",&local_409);
  local_408 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"--enumeration=c",&local_40a);
  local_40b = 0;
  local_3c0 = &local_400;
  local_3b8 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_40c);
  __l._M_len = local_3b8;
  __l._M_array = local_3c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3b0,__l,&local_40c);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_40c);
  local_810 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c0;
  do {
    local_810 = local_810 + -1;
    std::__cxx11::string::~string((string *)local_810);
  } while (local_810 != &local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_40a);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::__cxx11::ostringstream::ostringstream(local_588);
  std::__cxx11::ostringstream::ostringstream(local_700);
  local_710._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                 ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3b0);
  local_718._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                 ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_738,"overview",
             (allocator *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  bVar1 = pstore::command_line::details::
          parse_command_line_options<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::ostringstream,std::__cxx11::ostringstream>
                    (local_710,local_718,&local_738,
                     (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_588,
                     (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_700);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_701 = bVar1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_750,&local_701,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_750);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_780,(internal *)local_750,(AssertionResult *)"ok","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_760,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_modifiers.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=(&local_760,&local_758);
    testing::internal::AssertHelper::~AssertHelper(&local_760);
    std::__cxx11::string::~string((string *)&local_780);
    testing::Message::~Message(&local_758);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    lhs = pstore::command_line::
          opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
          ::get((opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
                 *)local_c0);
    local_79c = c;
    testing::internal::EqHelper::
    Compare<(anonymous_namespace)::enumeration,_(anonymous_namespace)::enumeration,_nullptr>
              ((EqHelper *)local_798,"enum_opt.get ()","enumeration::c",lhs,&local_79c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
    if (!bVar1) {
      testing::Message::Message(&local_7a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
      testing::internal::AssertHelper::AssertHelper
                (&local_7b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_modifiers.cpp"
                 ,0x65,pcVar2);
      testing::internal::AssertHelper::operator=(&local_7b0,&local_7a8);
      testing::internal::AssertHelper::~AssertHelper(&local_7b0);
      testing::Message::~Message(&local_7a8);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_700);
  std::__cxx11::ostringstream::~ostringstream(local_588);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3b0);
  pstore::command_line::
  opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  ::~opt((opt<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
          *)local_c0);
  return;
}

Assistant:

TEST_F (EnumerationParse, SetC) {
    opt<enumeration> enum_opt{
        "enumeration", values (literal{"a", static_cast<int> (enumeration::a), "a description"},
                               literal{"b", static_cast<int> (enumeration::b), "b description"},
                               literal{"c", static_cast<int> (enumeration::c), "c description"})};

    std::vector<std::string> argv{"progname", "--enumeration=c"};
    string_stream output;
    string_stream errors;
    bool ok = details::parse_command_line_options (std::begin (argv), std::end (argv), "overview",
                                                   output, errors);
    ASSERT_TRUE (ok);
    ASSERT_EQ (enum_opt.get (), enumeration::c);
}